

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

_binbuf * canvas_docopy(_glist *x)

{
  _selection *p_Var1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  _binbuf *x_00;
  t_selection *ptVar5;
  _outconnect *p_Var6;
  _selection *p_Var7;
  t_symbol *ptVar8;
  t_symbol *ptVar9;
  t_gobj *x_01;
  t_linetraverser t;
  
  x_00 = binbuf_new();
  for (x_01 = x->gl_list; x_01 != (t_gobj *)0x0; x_01 = x_01->g_next) {
    if (x->gl_editor != (t_editor *)0x0) {
      for (ptVar5 = x->gl_editor->e_selection; ptVar5 != (t_selection *)0x0;
          ptVar5 = ptVar5->sel_next) {
        if (ptVar5->sel_what == x_01) {
          gobj_save(x_01,x_00);
          break;
        }
      }
    }
  }
  linetraverser_start(&t,x);
  p_Var6 = linetraverser_next(&t);
  if (p_Var6 == (_outconnect *)0x0) {
    return x_00;
  }
LAB_0013c74f:
  if (x->gl_editor != (t_editor *)0x0) {
    p_Var7 = x->gl_editor->e_selection;
    for (p_Var1 = p_Var7; p_Var1 != (t_selection *)0x0; p_Var1 = p_Var1->sel_next) {
      if ((t_object *)p_Var1->sel_what == t.tr_ob) goto LAB_0013c78c;
    }
  }
  goto LAB_0013c814;
  while (p_Var7 = p_Var7->sel_next, p_Var7 != (_selection *)0x0) {
LAB_0013c78c:
    if ((t_object *)p_Var7->sel_what == t.tr_ob2) {
      ptVar8 = gensym("#X");
      ptVar9 = gensym("connect");
      uVar3 = glist_selectionindex(x,&(t.tr_ob)->te_g,1);
      iVar2 = t.tr_outno;
      uVar4 = glist_selectionindex(x,&(t.tr_ob2)->te_g,1);
      binbuf_addv(x_00,"ssiiii;",ptVar8,ptVar9,(ulong)uVar3,(ulong)(uint)iVar2,(ulong)uVar4,
                  (ulong)(uint)t.tr_inno);
      break;
    }
  }
LAB_0013c814:
  p_Var6 = linetraverser_next(&t);
  if (p_Var6 == (_outconnect *)0x0) {
    return x_00;
  }
  goto LAB_0013c74f;
}

Assistant:

static t_binbuf *canvas_docopy(t_canvas *x)
{
    t_gobj *y;
    t_linetraverser t;
    t_outconnect *oc;
    t_binbuf *b = binbuf_new();
    for (y = x->gl_list; y; y = y->g_next)
    {
        if (glist_isselected(x, y))
            gobj_save(y, b);
    }
    linetraverser_start(&t, x);
    while ((oc = linetraverser_next(&t)))
    {
        if (glist_isselected(x, &t.tr_ob->ob_g)
            && glist_isselected(x, &t.tr_ob2->ob_g))
        {
            binbuf_addv(b, "ssiiii;", gensym("#X"), gensym("connect"),
                glist_selectionindex(x, &t.tr_ob->ob_g, 1), t.tr_outno,
                glist_selectionindex(x, &t.tr_ob2->ob_g, 1), t.tr_inno);
        }
    }
    return (b);
}